

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLisp.cpp
# Opt level: O3

void __thiscall DL::DataLisp_Internal::~DataLisp_Internal(DataLisp_Internal *this)

{
  pointer ppSVar1;
  SyntaxTree *pSVar2;
  pointer ppSVar3;
  
  pSVar2 = this->mTree;
  if (pSVar2 == (SyntaxTree *)0x0) goto LAB_00109265;
  ppSVar3 = (pSVar2->Nodes).
            super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (pSVar2->Nodes).
            super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar3 == ppSVar1) {
LAB_0010923f:
    if (ppSVar3 != (pointer)0x0) {
      operator_delete(ppSVar3,(long)(pSVar2->Nodes).
                                    super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppSVar3);
    }
  }
  else {
    do {
      deleteNode(*ppSVar3);
      ppSVar3 = ppSVar3 + 1;
    } while (ppSVar3 != ppSVar1);
    pSVar2 = this->mTree;
    if (pSVar2 != (SyntaxTree *)0x0) {
      ppSVar3 = (pSVar2->Nodes).
                super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      goto LAB_0010923f;
    }
    pSVar2 = (SyntaxTree *)0x0;
  }
  operator_delete(pSVar2,0x18);
LAB_00109265:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&)>_>_>
  ::~_Rb_tree(&(this->mExpressions)._M_t);
  return;
}

Assistant:

~DataLisp_Internal()
	{
		if (mTree) {
			for (StatementNode* ptr : mTree->Nodes)
				deleteNode(ptr);

			delete mTree;
		}
	}